

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

_Bool sysbvm_string_equalsCString(sysbvm_tuple_t string,char *cstring)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  
  if ((string & 0xf) == 0 && string != 0) {
    uVar1 = *(uint *)(string + 0xc);
    sVar3 = strlen(cstring);
    if (sVar3 == uVar1) {
      iVar2 = bcmp((void *)(string + 0x10),cstring,(ulong)uVar1);
      return iVar2 == 0;
    }
  }
  return false;
}

Assistant:

SYSBVM_API bool sysbvm_string_equalsCString(sysbvm_tuple_t string, const char *cstring)
{
    if(!sysbvm_tuple_isNonNullPointer(string))
        return false;

    size_t firstSize = sysbvm_tuple_getSizeInBytes(string);
    size_t secondSize = strlen(cstring);
    if(firstSize != secondSize)
        return false;

    uint8_t *firstBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes;
    return memcmp(firstBytes, cstring, firstSize) == 0;
}